

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cpp
# Opt level: O3

uint32_t __thiscall spvtools::opt::Pass::GetPointeeTypeId(Pass *this,Instruction *ptrInst)

{
  IRContext *this_00;
  uint32_t uVar1;
  Instruction *this_01;
  uint uVar2;
  
  uVar1 = 0;
  if (ptrInst->has_type_id_ == true) {
    uVar1 = Instruction::GetSingleWordOperand(ptrInst,0);
  }
  this_00 = this->context_;
  if ((this_00->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(this_00);
  }
  this_01 = analysis::DefUseManager::GetDef
                      ((this_00->def_use_mgr_)._M_t.
                       super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                       .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                       _M_head_impl,uVar1);
  uVar2 = (this_01->has_result_id_ & 1) + 1;
  if (this_01->has_type_id_ == false) {
    uVar2 = (uint)this_01->has_result_id_;
  }
  uVar1 = Instruction::GetSingleWordOperand(this_01,uVar2 + 1);
  return uVar1;
}

Assistant:

uint32_t Pass::GetPointeeTypeId(const Instruction* ptrInst) const {
  const uint32_t ptrTypeId = ptrInst->type_id();
  const Instruction* ptrTypeInst = get_def_use_mgr()->GetDef(ptrTypeId);
  return ptrTypeInst->GetSingleWordInOperand(kTypePointerTypeIdInIdx);
}